

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O2

CTcPrsGramNode * __thiscall CTcPrsGramNodeCat::clone_expansion(CTcPrsGramNodeCat *this)

{
  CTcPrsGramNode *pCVar1;
  CTcTokenSource *pCVar2;
  int iVar3;
  CTcPrsGramNode *pCVar4;
  undefined4 extraout_var;
  CTcPrsGramNode *pCVar6;
  CTcPrsGramNode **ppCVar7;
  CTcTokenSource *pCVar5;
  
  pCVar4 = (CTcPrsGramNode *)CTcPrsMem::alloc(G_prsmem,0x58);
  (pCVar4->super_CTcTokenSource).enclosing_src_ = (CTcTokenSource *)0x0;
  *(undefined8 *)&(pCVar4->super_CTcTokenSource).enclosing_curtok_ = 0;
  (pCVar4->super_CTcTokenSource).enclosing_curtok_.text_ = (char *)0x0;
  (pCVar4->super_CTcTokenSource).enclosing_curtok_.text_len_ = 0;
  (pCVar4->super_CTcTokenSource).enclosing_curtok_.int_val_ = 0;
  *(undefined8 *)&(pCVar4->super_CTcTokenSource).enclosing_curtok_.field_0x20 = 0;
  pCVar4->next_ = (CTcPrsGramNode *)0x0;
  pCVar4[1].super_CTcTokenSource._vptr_CTcTokenSource = (_func_int **)0x0;
  pCVar4[1].super_CTcTokenSource.enclosing_src_ = (CTcTokenSource *)0x0;
  *(undefined8 *)&pCVar4[1].super_CTcTokenSource.enclosing_curtok_ = 0;
  (pCVar4->super_CTcTokenSource)._vptr_CTcTokenSource = (_func_int **)&PTR__CTcTokenSource_0034f468;
  ppCVar7 = &(this->super_CTcPrsGramNodeWithChildren).sub_head_;
  while (pCVar1 = *ppCVar7, pCVar1 != (CTcPrsGramNode *)0x0) {
    iVar3 = (*(pCVar1->super_CTcTokenSource)._vptr_CTcTokenSource[10])(pCVar1);
    pCVar5 = (CTcTokenSource *)CONCAT44(extraout_var,iVar3);
    pCVar2 = pCVar4[1].super_CTcTokenSource.enclosing_src_;
    pCVar6 = (CTcPrsGramNode *)(pCVar2 + 1);
    if (pCVar2 == (CTcTokenSource *)0x0) {
      pCVar6 = pCVar4 + 1;
    }
    (pCVar6->super_CTcTokenSource)._vptr_CTcTokenSource = (_func_int **)pCVar5;
    pCVar4[1].super_CTcTokenSource.enclosing_src_ = pCVar5;
    pCVar5[1]._vptr_CTcTokenSource = (_func_int **)0x0;
    ppCVar7 = &pCVar1->next_;
  }
  return pCVar4;
}

Assistant:

virtual CTcPrsGramNode *clone_expansion() const
    {
        /* create a new 'cat' node */
        CTcPrsGramNodeCat *new_cat = new (G_prsmem) CTcPrsGramNodeCat();

        /* add a clone of each of my children and add it to my replica */
        for (CTcPrsGramNode *cur = sub_head_ ; cur != 0 ; cur = cur->next_)
            new_cat->add_sub_item(cur->clone_expansion());

        /* return my replica */
        return new_cat;
    }